

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall cmExtraEclipseCDT4Generator::Generate(cmExtraEclipseCDT4Generator *this)

{
  string *__rhs;
  pointer puVar1;
  cmMakefile *this_00;
  bool bVar2;
  int iVar3;
  string *psVar4;
  uint majorVersion;
  uint minorVersion;
  string local_2a0;
  string eclipseVersion;
  RegularExpression regex;
  
  puVar1 = (((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = *(cmMakefile **)
             ((long)(puVar1->_M_t).
                    super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                    _M_t + 0x70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&regex,"CMAKE_ECLIPSE_VERSION",(allocator<char> *)&local_2a0);
  psVar4 = cmMakefile::GetSafeDefinition(this_00,(string *)&regex);
  std::__cxx11::string::string((string *)&eclipseVersion,(string *)psVar4);
  std::__cxx11::string::~string((string *)&regex);
  cmsys::RegularExpression::RegularExpression(&regex,".*([0-9]+\\.[0-9]+).*");
  bVar2 = cmsys::RegularExpression::find(&regex,eclipseVersion._M_dataplus._M_p);
  if (bVar2) {
    majorVersion = 0;
    minorVersion = 0;
    cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_2a0,&regex.regmatch,1);
    iVar3 = __isoc99_sscanf(local_2a0._M_dataplus._M_p,"%u.%u",&majorVersion,&minorVersion);
    std::__cxx11::string::~string((string *)&local_2a0);
    if (iVar3 == 2) {
      iVar3 = majorVersion * 1000 + minorVersion;
      if (iVar3 < 0xbbe) {
        this->SupportsVirtualFolders = false;
        this->SupportsMachO64Parser = false;
      }
      else if (iVar3 != 0xbbe) goto LAB_0043bd65;
      this->SupportsGmakeErrorParser = false;
    }
  }
LAB_0043bd65:
  cmLocalGenerator::GetSourceDirectory_abi_cxx11_
            ((cmLocalGenerator *)
             (puVar1->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t);
  psVar4 = &this->HomeDirectory;
  std::__cxx11::string::_M_assign((string *)psVar4);
  cmLocalGenerator::GetBinaryDirectory_abi_cxx11_
            ((cmLocalGenerator *)
             (puVar1->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t);
  __rhs = &this->HomeOutputDirectory;
  std::__cxx11::string::_M_assign((string *)__rhs);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"CMAKE_ECLIPSE_GENERATE_LINKED_RESOURCES",
             (allocator<char> *)&majorVersion);
  bVar2 = cmMakefile::IsOn(this_00,&local_2a0);
  this->GenerateLinkedResources = bVar2;
  std::__cxx11::string::~string((string *)&local_2a0);
  bVar2 = std::operator!=(psVar4,__rhs);
  this->IsOutOfSourceBuild = bVar2;
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT",
               (allocator<char> *)&majorVersion);
    bVar2 = cmMakefile::IsOn(this_00,&local_2a0);
    this->GenerateSourceProject = bVar2;
    std::__cxx11::string::~string((string *)&local_2a0);
    if ((this->GenerateSourceProject & 1U) != 0) goto LAB_0043be92;
  }
  else {
    this->GenerateSourceProject = false;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a0,"ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT",
             (allocator<char> *)&majorVersion);
  bVar2 = cmMakefile::IsOn(this_00,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,
               "ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT is set to TRUE, but this variable is not supported anymore since CMake 2.8.7.\nEnable CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT instead."
               ,(allocator<char> *)&majorVersion);
    cmMakefile::IssueMessage(this_00,WARNING,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
LAB_0043be92:
  bVar2 = cmsys::SystemTools::IsSubDirectory(__rhs,psVar4);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,
               "The build directory is a subdirectory of the source directory.\nThis is not supported well by Eclipse. It is strongly recommended to use a build directory which is a sibling of the source directory."
               ,(allocator<char> *)&majorVersion);
    cmMakefile::IssueMessage(this_00,WARNING,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if (this->GenerateSourceProject == true) {
    CreateSourceProjectFile(this);
  }
  CreateProjectFile(this);
  CreateCProjectFile(this);
  CreateSettingsResourcePrefsFile(this);
  cmsys::RegularExpression::~RegularExpression(&regex);
  std::__cxx11::string::~string((string *)&eclipseVersion);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::Generate()
{
  const auto& lg = this->GlobalGenerator->GetLocalGenerators()[0];
  const cmMakefile* mf = lg->GetMakefile();

  std::string eclipseVersion = mf->GetSafeDefinition("CMAKE_ECLIPSE_VERSION");
  cmsys::RegularExpression regex(".*([0-9]+\\.[0-9]+).*");
  if (regex.find(eclipseVersion)) {
    unsigned int majorVersion = 0;
    unsigned int minorVersion = 0;
    int res =
      sscanf(regex.match(1).c_str(), "%u.%u", &majorVersion, &minorVersion);
    if (res == 2) {
      int version = majorVersion * 1000 + minorVersion;
      if (version < 3006) // 3.6 is Helios
      {
        this->SupportsVirtualFolders = false;
        this->SupportsMachO64Parser = false;
      }
      if (version < 3007) // 3.7 is Indigo
      {
        this->SupportsGmakeErrorParser = false;
      }
    }
  }

  // TODO: Decide if these are local or member variables
  this->HomeDirectory = lg->GetSourceDirectory();
  this->HomeOutputDirectory = lg->GetBinaryDirectory();

  this->GenerateLinkedResources =
    mf->IsOn("CMAKE_ECLIPSE_GENERATE_LINKED_RESOURCES");

  this->IsOutOfSourceBuild =
    (this->HomeDirectory != this->HomeOutputDirectory);

  this->GenerateSourceProject =
    (this->IsOutOfSourceBuild &&
     mf->IsOn("CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT"));

  if (!this->GenerateSourceProject &&
      (mf->IsOn("ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT"))) {
    mf->IssueMessage(
      MessageType::WARNING,
      "ECLIPSE_CDT4_GENERATE_SOURCE_PROJECT is set to TRUE, "
      "but this variable is not supported anymore since CMake 2.8.7.\n"
      "Enable CMAKE_ECLIPSE_GENERATE_SOURCE_PROJECT instead.");
  }

  if (cmSystemTools::IsSubDirectory(this->HomeOutputDirectory,
                                    this->HomeDirectory)) {
    mf->IssueMessage(MessageType::WARNING,
                     "The build directory is a subdirectory "
                     "of the source directory.\n"
                     "This is not supported well by Eclipse. It is strongly "
                     "recommended to use a build directory which is a "
                     "sibling of the source directory.");
  }

  // NOTE: This is not good, since it pollutes the source tree. However,
  //       Eclipse doesn't allow CVS/SVN to work when the .project is not in
  //       the cvs/svn root directory. Hence, this is provided as an option.
  if (this->GenerateSourceProject) {
    // create .project file in the source tree
    this->CreateSourceProjectFile();
  }

  // create a .project file
  this->CreateProjectFile();

  // create a .cproject file
  this->CreateCProjectFile();

  // create resource settings
  this->CreateSettingsResourcePrefsFile();
}